

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O3

void __thiscall
kj::(anonymous_namespace)::expectResImpl<kj::Array<char16_t>,char16_t>
          (_anonymous_namespace_ *this,EncodingResult<kj::Array<char16_t>_> *result,
          ArrayPtr<const_char16_t> expected,bool errors)

{
  unsigned_short i_00;
  int iVar1;
  char16_t *pcVar2;
  char16_t *pcVar3;
  CappedArray<char,_5UL> CVar4;
  unsigned_long i;
  CappedArray<char,_5UL> local_50;
  CappedArray<char,_5UL> local_40;
  
  pcVar2 = expected.ptr;
  if ((int)expected.size_ == 0) {
    if (((byte)this[0x18] & _::Debug::minSeverity < 3) == 1) {
      _::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x2d,ERROR,"\"failed: expected \" \"!result.hadErrors\"",
                 (char (*) [35])"failed: expected !result.hadErrors");
    }
  }
  else if (this[0x18] == (_anonymous_namespace_)0x0 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[34]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x2b,ERROR,"\"failed: expected \" \"result.hadErrors\"",
               (char (*) [34])"failed: expected result.hadErrors");
  }
  pcVar3 = *(char16_t **)(this + 8);
  if ((pcVar3 != pcVar2) && (_::Debug::minSeverity < 3)) {
    local_50.currentSize = (size_t)pcVar2;
    local_40.currentSize = (size_t)pcVar3;
    _::Debug::log<char_const(&)[50],unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x30,ERROR,
               "\"failed: expected \" \"result.size() == expected.size()\", result.size(), expected.size()"
               ,(char (*) [50])"failed: expected result.size() == expected.size()",
               &local_40.currentSize,&local_50.currentSize);
    pcVar3 = *(char16_t **)(this + 8);
  }
  if (pcVar3 < pcVar2) {
    pcVar2 = pcVar3;
  }
  if (pcVar2 != (char16_t *)0x0) {
    pcVar3 = (char16_t *)0x0;
    iVar1 = _::Debug::minSeverity;
    do {
      i_00 = *(unsigned_short *)(*(long *)this + (long)pcVar3 * 2);
      if ((i_00 != *(unsigned_short *)
                    ((long)&(result->super_Array<char16_t>).ptr + (long)pcVar3 * 2)) && (iVar1 < 3))
      {
        i = (unsigned_long)pcVar3;
        CVar4 = hex(i_00);
        local_40.currentSize = CVar4.currentSize;
        local_40.content._0_4_ = CVar4.content._0_4_;
        local_40.content[4] = CVar4.content[4];
        CVar4 = hex(*(unsigned_short *)((long)&(result->super_Array<char16_t>).ptr + i * 2));
        local_50.currentSize = CVar4.currentSize;
        local_50.content._0_4_ = CVar4.content._0_4_;
        local_50.content[4] = CVar4.content[4];
        _::Debug::
        log<char_const(&)[42],unsigned_long&,kj::CappedArray<char,5ul>,kj::CappedArray<char,5ul>>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
                   ,0x32,ERROR,
                   "\"failed: expected \" \"result[i] == expected[i]\", i, hex(result[i]), hex(expected[i])"
                   ,(char (*) [42])"failed: expected result[i] == expected[i]",&i,&local_40,
                   &local_50);
        iVar1 = _::Debug::minSeverity;
      }
      pcVar3 = (char16_t *)((long)pcVar3 + 1);
    } while (pcVar2 != pcVar3);
  }
  return;
}

Assistant:

void expectResImpl(EncodingResult<T> result,
                   ArrayPtr<const U> expected,
                   bool errors = false) {
  if (errors) {
    KJ_EXPECT(result.hadErrors);
  } else {
    KJ_EXPECT(!result.hadErrors);
  }

  KJ_EXPECT(result.size() == expected.size(), result.size(), expected.size());
  for (auto i: kj::zeroTo(kj::min(result.size(), expected.size()))) {
    KJ_EXPECT(result[i] == expected[i], i, hex(result[i]), hex(expected[i]));
  }
}